

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance
          (ModelBaseEKFFlexEstimatorIMU *this,double d)

{
  ExtendedKalmanFilter *this_00;
  long lVar1;
  long lVar2;
  double dVar3;
  double *pdVar4;
  ulong uVar5;
  Index IVar6;
  Index IVar7;
  ulong uVar8;
  Pmatrix local_30;
  
  this->unmodeledForceVariance_ = d;
  if (0.0 < d) {
    setWithUnmodeledForces(this,true);
  }
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::getStateCovariance(&local_30,&this_00->super_KalmanFilterBase);
  pdVar4 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  IVar6 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  IVar7 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       pdVar4;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = IVar6
  ;
  local_30.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = IVar7
  ;
  free(pdVar4);
  uVar8 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  if (((long)uVar8 < 0) ||
     (uVar5 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows, (long)uVar5 < 0)) {
    __assert_fail("a_index <= m_matrix.cols() && -a_index <= m_matrix.rows()",
                  "/usr/include/eigen3/Eigen/src/Core/Diagonal.h",0x4b,
                  "Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>::Diagonal(MatrixType &, Index) [MatrixType = Eigen::Matrix<double, -1, -1>, Index = 0]"
                 );
  }
  if (uVar5 <= uVar8) {
    uVar8 = uVar5;
  }
  if (0x1d < uVar8) {
    pdVar4 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    lVar1 = uVar5 + 1;
    lVar2 = uVar5 * 8 + 8;
    dVar3 = this->unmodeledForceVariance_;
    pdVar4[lVar2 * 3] = dVar3;
    pdVar4[lVar2 * 3 + uVar5 + 1] = dVar3;
    pdVar4[lVar2 * 3 + lVar1 * 2] = dVar3;
    pdVar4[lVar2 * 3 + uVar5 * 3 + 3] = dVar3;
    pdVar4[lVar2 * 3 + lVar1 * 4] = dVar3;
    pdVar4[lVar2 * 3 + lVar1 * 5] = dVar3;
    KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&this->P_);
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>, 6, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>, BlockRows = 6, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance(double d)
{
  unmodeledForceVariance_ = d;
  if(d > 0)
  {
    setWithUnmodeledForces(true);
  }
  P_ = ekf_.getStateCovariance();
  P_.diagonal().segment<6>(state::unmodeledForces).setConstant(unmodeledForceVariance_);
  ekf_.setStateCovariance(P_);
}